

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O3

bool Diligent::VerifyTLASResourceBinding<Diligent::TopLevelASVkImpl>
               (PipelineResourceDesc *ResDesc,BindResourceInfo *BindInfo,TopLevelASVkImpl *pTLASImpl
               ,IDeviceObject *pCachedAS,char *SignatureName)

{
  bool bVar1;
  string msg;
  string local_50;
  
  if (BindInfo->BufferRangeSize != 0 || BindInfo->BufferBaseOffset != 0) {
    FormatString<char[42]>(&local_50,(char (*) [42])"Buffer range can\'t be specified for TLAS.");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"VerifyTLASResourceBinding",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x211);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = VerifyResourceBinding<Diligent::TopLevelASVkImpl>
                    ("TLAS",ResDesc,BindInfo,pTLASImpl,pCachedAS,SignatureName);
  return bVar1;
}

Assistant:

bool VerifyTLASResourceBinding(const PipelineResourceDesc& ResDesc,
                               const BindResourceInfo&     BindInfo,
                               const TLASImplType*         pTLASImpl,
                               const IDeviceObject*        pCachedAS,
                               const char*                 SignatureName)
{
    if (BindInfo.BufferBaseOffset != 0 || BindInfo.BufferRangeSize != 0)
    {
        RESOURCE_VALIDATION_FAILURE("Buffer range can't be specified for TLAS.");
    }
    return VerifyResourceBinding("TLAS", ResDesc, BindInfo, pTLASImpl, pCachedAS, SignatureName);
}